

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

lys_node * resolve_json_nodeid(char *nodeid,ly_ctx *ctx,lys_node *start,int output)

{
  char cVar1;
  LYS_NODE LVar2;
  int iVar3;
  lys_node_list *node;
  lys_node_list *list;
  lys_node_list *node_00;
  lys_module *plVar4;
  lys_module *plVar5;
  char *pcVar6;
  lys_module *module;
  LY_ECODE ecode;
  ly_ctx *ctx_00;
  uint uVar7;
  ulong uVar8;
  char *yang_data_name;
  char *pcVar9;
  size_t __n;
  int local_80;
  char *local_78;
  char *name;
  char *local_68;
  int local_5c;
  char *pcStack_58;
  int has_predicate;
  char *mod_name;
  ly_ctx *plStack_48;
  int nam_len;
  uint local_3c;
  int local_38;
  int r;
  int is_relative;
  int mod_name_len;
  
  local_38 = -1;
  if ((nodeid == (char *)0x0) || (ctx == (ly_ctx *)0x0 && start == (lys_node *)0x0)) {
    __assert_fail("nodeid && (ctx || start)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x931,
                  "const struct lys_node *resolve_json_nodeid(const char *, const struct ly_ctx *, const struct lys_node *, int)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    ctx = start->module->ctx;
  }
  local_3c = parse_schema_nodeid(nodeid,&stack0xffffffffffffffa8,&r,&local_78,
                                 (int *)((long)&mod_name + 4),&local_38,(int *)0x0,(int *)0x0,1);
  if ((int)local_3c < 1) {
    local_78 = nodeid + -local_3c;
    cVar1 = nodeid[-local_3c];
  }
  else {
    if (*local_78 == '#') {
      if (local_38 != 0) {
        uVar8 = 0x23;
        goto LAB_001141fa;
      }
      yang_data_name = local_78 + 1;
      name = (char *)CONCAT44(name._4_4_,mod_name._4_4_ + -1);
      pcVar9 = nodeid + local_3c;
      pcVar6 = pcStack_58;
      local_80 = r;
    }
    else {
      local_38 = -1;
      pcVar6 = (char *)0x0;
      yang_data_name = (char *)0x0;
      pcVar9 = nodeid;
    }
    local_68 = nodeid;
    plStack_48 = ctx;
    local_3c = parse_schema_nodeid(pcVar9,&stack0xffffffffffffffa8,&r,&local_78,
                                   (int *)((long)&mod_name + 4),&local_38,&local_5c,(int *)0x0,0);
    uVar8 = (ulong)local_3c;
    if (0 < (int)local_3c) {
      if (pcVar6 != (char *)0x0) {
        pcStack_58 = pcVar6;
        r = local_80;
      }
      if (local_38 == 0) {
        if (pcStack_58 == (char *)0x0) {
          ly_vlog(plStack_48,LYE_PATH_MISSMOD,LY_VLOG_STR,local_68);
          return (lys_node *)0x0;
        }
        pcVar6 = strndup(pcStack_58,(long)r);
        ctx_00 = plStack_48;
        module = ly_ctx_get_module(plStack_48,pcVar6,(char *)0x0,1);
        free(pcVar6);
        if (module == (lys_module *)0x0) {
          pcVar9 = strndup(local_68,(size_t)(pcStack_58 + ((long)r - (long)local_68)));
LAB_0011426e:
          ecode = LYE_PATH_INMOD;
LAB_00114273:
          ly_vlog(ctx_00,ecode,LY_VLOG_STR,pcVar9);
          free(pcVar9);
          return (lys_node *)0x0;
        }
        if (yang_data_name == (char *)0x0) {
          node = (lys_node_list *)0x0;
        }
        else {
          node = (lys_node_list *)lyp_get_yang_data_template(module,yang_data_name,(int)name);
          if (node == (lys_node_list *)0x0) {
            local_78 = yang_data_name + ((long)(int)name - (long)local_68);
LAB_001141c6:
            pcVar9 = strndup(local_68,(size_t)local_78);
            ecode = LYE_PATH_INNODE;
            ctx_00 = plStack_48;
            goto LAB_00114273;
          }
        }
        pcStack_58 = (char *)0x0;
        r = 0;
      }
      else {
        node = (lys_node_list *)start;
        if (start == (lys_node *)0x0) {
          __assert_fail("start",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0x957,
                        "const struct lys_node *resolve_json_nodeid(const char *, const struct ly_ctx *, const struct lys_node *, int)"
                       );
        }
        do {
          if (node->nodetype != LYS_USES) break;
          node = (lys_node_list *)lys_parent((lys_node *)node);
        } while (node != (lys_node_list *)0x0);
        module = start->module;
      }
      pcVar9 = pcVar9 + uVar8;
      name = (char *)module;
      do {
        for (list = (lys_node_list *)lys_getnext((lys_node *)0x0,(lys_node *)node,module,0);
            plVar4 = (lys_module *)name, list != (lys_node_list *)0x0;
            list = (lys_node_list *)lys_getnext((lys_node *)list,(lys_node *)node,module,0)) {
          pcVar6 = list->name;
          if (pcVar6 != (char *)0x0) {
            __n = (size_t)mod_name._4_4_;
            iVar3 = strncmp(local_78,pcVar6,__n);
            if ((iVar3 == 0) && (node_00 = list, pcVar6[__n] == '\0')) {
              do {
                node_00 = (lys_node_list *)lys_parent((lys_node *)node_00);
                if (node_00 == (lys_node_list *)0x0) goto LAB_00113fb9;
                LVar2 = node_00->nodetype;
              } while ((LVar2 & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN);
              if (output == 0) {
                if (LVar2 != LYS_OUTPUT) goto LAB_00113fb9;
              }
              else if (LVar2 != LYS_INPUT) {
LAB_00113fb9:
                plVar4 = (lys_module *)name;
                if ((pcStack_58 != (char *)0x0) &&
                   (plVar4 = ly_ctx_nget_module(plStack_48,pcStack_58,(long)r,(char *)0x0,1),
                   plVar4 == (lys_module *)0x0)) {
                  pcVar9 = strndup(local_68,(size_t)(pcStack_58 + ((long)r - (long)local_68)));
                  ctx_00 = plStack_48;
                  goto LAB_0011426e;
                }
                plVar5 = lys_node_module((lys_node *)list);
                if (plVar4 == plVar5) {
                  if (local_5c == 0) {
LAB_001140e9:
                    uVar7 = (uint)*pcVar9;
                    if (uVar7 == 0) {
                      return (lys_node *)list;
                    }
                    if ((list->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                      node = list;
                      plVar4 = module;
                      if (list->child != (lys_node *)0x0) {
                        plVar4 = lys_node_module(list->child);
                      }
                      break;
                    }
                  }
                  else {
                    local_3c = 0;
                    if ((list->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
                      local_3c = parse_schema_json_predicate
                                           (pcVar9,(char **)0x0,(int *)0x0,(char **)0x0,(int *)0x0,
                                            (char **)0x0,(int *)0x0,&local_5c);
                      if (0 < (int)local_3c) {
LAB_001140e2:
                        pcVar9 = pcVar9 + (int)local_3c;
                        goto LAB_001140e9;
                      }
                      goto LAB_001141df;
                    }
                    if (list->nodetype == LYS_LIST) {
                      iVar3 = resolve_json_schema_list_predicate(pcVar9,list,(int *)&local_3c);
                      if (iVar3 != 0) {
                        return (lys_node *)0x0;
                      }
                      goto LAB_001140e2;
                    }
                    uVar7 = (uint)*pcVar9;
                  }
                  local_78 = pcVar9;
                  uVar8 = (ulong)uVar7;
                  ctx = plStack_48;
                  goto LAB_001141fa;
                }
              }
            }
          }
        }
        name = (char *)plVar4;
        if (list == (lys_node_list *)0x0) {
          local_78 = local_78 + ((long)mod_name._4_4_ - (long)local_68);
          goto LAB_001141c6;
        }
        local_3c = parse_schema_nodeid(pcVar9,&stack0xffffffffffffffa8,&r,&local_78,
                                       (int *)((long)&mod_name + 4),&local_38,&local_5c,(int *)0x0,0
                                      );
        if ((int)local_3c < 1) goto LAB_001141df;
        pcVar9 = pcVar9 + local_3c;
      } while( true );
    }
    local_78 = pcVar9 + -local_3c;
    cVar1 = pcVar9[-local_3c];
    ctx = plStack_48;
  }
LAB_001141f1:
  uVar8 = (ulong)(uint)(int)cVar1;
LAB_001141fa:
  ly_vlog(ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar8,local_78);
  return (lys_node *)0x0;
LAB_001141df:
  local_78 = pcVar9 + -local_3c;
  cVar1 = pcVar9[-local_3c];
  ctx = plStack_48;
  goto LAB_001141f1;
}

Assistant:

const struct lys_node *
resolve_json_nodeid(const char *nodeid, const struct ly_ctx *ctx, const struct lys_node *start, int output)
{
    char *str;
    const char *name, *mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    const struct lys_node *sibling, *start_parent, *parent;
    int r, nam_len, mod_name_len, is_relative = -1, has_predicate;
    int yang_data_name_len, backup_mod_name_len;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *prefix_mod, *module, *prev_mod;

    assert(nodeid && (ctx || start));
    if (!ctx) {
        ctx = start->module->ctx;
    }

    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return NULL;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        id += r;
    } else {
        is_relative = -1;
    }

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    if (is_relative) {
        assert(start);
        start_parent = start;
        while (start_parent && (start_parent->nodetype == LYS_USES)) {
            start_parent = lys_parent(start_parent);
        }
        module = start->module;
    } else {
        if (!mod_name) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_STR, nodeid);
            free(str);
            return NULL;
        }

        str = strndup(mod_name, mod_name_len);
        module = ly_ctx_get_module(ctx, str, NULL, 1);
        free(str);

        if (!module) {
            str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        start_parent = NULL;
        if (yang_data_name) {
            start_parent = lyp_get_yang_data_template(module, yang_data_name, yang_data_name_len);
            if (!start_parent) {
                str = strndup(nodeid, (yang_data_name + yang_data_name_len) - nodeid);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return NULL;
            }
        }

        /* now it's as if there was no module name */
        mod_name = NULL;
        mod_name_len = 0;
    }

    prev_mod = module;

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module, 0))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                /* output check */
                for (parent = lys_parent(sibling); parent && !(parent->nodetype & (LYS_INPUT | LYS_OUTPUT)); parent = lys_parent(parent));
                if (parent) {
                    if (output && (parent->nodetype == LYS_INPUT)) {
                        continue;
                    } else if (!output && (parent->nodetype == LYS_OUTPUT)) {
                        continue;
                    }
                }

                /* module check */
                if (mod_name) {
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_nget_module(ctx, mod_name, mod_name_len, NULL, 1);

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lys_node_module(sibling)) {
                    continue;
                }

                /* do we have some predicates on it? */
                if (has_predicate) {
                    r = 0;
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if ((r = parse_schema_json_predicate(id, NULL, NULL, NULL, NULL, NULL, NULL, &has_predicate)) < 1) {
                            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                            return NULL;
                        }
                    } else if (sibling->nodetype == LYS_LIST) {
                        if (resolve_json_schema_list_predicate(id, (const struct lys_node_list *)sibling, &r)) {
                            return NULL;
                        }
                    } else {
                        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    id += r;
                }

                /* the result node? */
                if (!id[0]) {
                    return sibling;
                }

                /* move down the tree, if possible */
                if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                    return NULL;
                }
                start_parent = sibling;

                /* update prev mod */
                prev_mod = (start_parent->child ? lys_node_module(start_parent->child) : module);
                break;
            }
        }

        /* no match */
        if (!sibling) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return NULL;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(ctx);
    return NULL;
}